

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::reserve
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this,
          size_t capacity)

{
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *this_00;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *o;
  long lVar1;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar2;
  ulong uVar3;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar4;
  ulong uVar5;
  bool bVar6;
  
  if (capacity <= this->_capacity) {
    return;
  }
  uVar3 = capacity * 0x30;
  if (uVar3 == 0) {
    pMVar2 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar3 < 0x11) {
    pMVar2 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar3 < 0x19) {
    pMVar2 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             FixedSizeAllocator<24UL>::alloc
                       ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar3 < 0x21) {
    pMVar2 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar3 < 0x31) {
    pMVar2 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar3 < 0x41) {
    pMVar2 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pMVar2 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)::operator_new(uVar3,0x10);
  }
  pMVar4 = this->_stack;
  if (pMVar4 == (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0) {
    this->_stack = pMVar2;
    this->_cursor = pMVar2;
    this->_capacity = capacity;
    goto LAB_0048fed0;
  }
  if (this->_cursor == pMVar4) {
LAB_0048fdf1:
    uVar3 = this->_capacity * 0x30;
    if (uVar3 == 0) {
      (pMVar4->numeral)._num._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      (pMVar4->numeral)._num._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pMVar4;
    }
    else if (uVar3 < 0x11) {
      (pMVar4->numeral)._num._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
      (pMVar4->numeral)._num._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pMVar4;
    }
    else if (uVar3 < 0x19) {
      (pMVar4->numeral)._num._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
      (pMVar4->numeral)._num._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pMVar4;
    }
    else if (uVar3 < 0x21) {
      (pMVar4->numeral)._num._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      (pMVar4->numeral)._num._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pMVar4;
    }
    else if (uVar3 < 0x31) {
      (pMVar4->numeral)._num._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      (pMVar4->numeral)._num._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pMVar4;
    }
    else if (uVar3 < 0x41) {
      (pMVar4->numeral)._num._val[0]._mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
      (pMVar4->numeral)._num._val[0]._mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pMVar4;
    }
    else {
      operator_delete(pMVar4,0x10);
    }
  }
  else {
    uVar3 = 0;
    uVar5 = 1;
    do {
      this_00 = pMVar2 + uVar3;
      o = pMVar4 + uVar3;
      Kernel::IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)this_00,(IntegerConstantType *)o);
      Kernel::IntegerConstantType::IntegerConstantType
                (&pMVar2[uVar3].numeral._den,&pMVar4[uVar3].numeral._den);
      (this_00->factors)._id = (o->factors)._id;
      (this_00->factors)._ptr = (o->factors)._ptr;
      pMVar4 = this->_stack;
      uVar3 = ((long)this->_cursor - (long)pMVar4 >> 4) * -0x5555555555555555;
      bVar6 = uVar5 <= uVar3;
      lVar1 = uVar3 - uVar5;
      uVar3 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar6 && lVar1 != 0);
    if (pMVar4 != (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0) goto LAB_0048fdf1;
  }
  this->_cursor =
       (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
       (((long)this->_cursor - (long)this->_stack) + (long)pMVar2);
  this->_capacity = capacity;
  this->_stack = pMVar2;
LAB_0048fed0:
  this->_end = pMVar2 + capacity;
  return;
}

Assistant:

inline
  void reserve(size_t capacity) 
  {
    if (_capacity >= capacity) {
      return;
    }
    C* mem = static_cast<C*>(ALLOC_KNOWN(capacity*sizeof(C),className()));
    if (_stack) {
      for (unsigned i = 0; i < size(); i++) {
        ::new(&mem[i]) C(std::move((*this)[i]));
      }
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());

      _cursor = mem + (_cursor - _stack);
      _capacity = capacity;
      _stack = mem;
      _end = _stack + _capacity;
    } else {
      _stack = mem;
      _cursor = mem;
      _capacity = capacity;
      _end = _stack + _capacity;
    }
  }